

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_gprim_predefined<tinyusdz::GeomCylinder>
                   (string *__return_storage_ptr__,GeomCylinder *gprim,uint32_t indent)

{
  uint32_t indent_00;
  uint32_t in_R9D;
  string *psVar1;
  stringstream ss;
  string local_208;
  string local_1e8;
  string *local_1c8;
  ListEditQual local_1bc;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"doubleSided","");
  print_typed_attr<bool>(&local_1e8,&(gprim->super_GPrim).doubleSided,&local_208,indent);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"orientation","");
  print_typed_token_attr<tinyusdz::Orientation>
            (&local_1e8,&(gprim->super_GPrim).orientation,&local_208,indent);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  psVar1 = local_1c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"purpose","");
  print_typed_token_attr<tinyusdz::Purpose>
            (&local_1e8,&(gprim->super_GPrim).purpose,&local_208,indent);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"extent","");
  print_typed_attr<tinyusdz::Extent>(&local_1e8,&(gprim->super_GPrim).extent,&local_208,indent);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"visibility","");
  indent_00 = indent;
  print_typed_token_attr<tinyusdz::Visibility>
            (&local_1e8,&(gprim->super_GPrim).visibility,&local_208,indent);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  print_material_binding_abi_cxx11_
            (&local_1e8,(tinyusdz *)&(gprim->super_GPrim).super_MaterialBinding,
             (MaterialBinding *)(ulong)indent,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  print_collection_abi_cxx11_
            (&local_1e8,(tinyusdz *)&(gprim->super_GPrim).super_Collection,
             (Collection *)(ulong)indent,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((gprim->super_GPrim).proxyPrim._authored == true) {
    local_1bc = (gprim->super_GPrim).proxyPrim._relationship.listOpQual;
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"proxyPrim","");
    indent_00 = (uint32_t)&local_208;
    anon_unknown_173::print_relationship
              (&local_1e8,&(gprim->super_GPrim).proxyPrim._relationship,&local_1bc,
               SUB81(&local_208,0),(string *)(ulong)indent,in_R9D);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    psVar1 = local_1c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      psVar1 = local_1c8;
    }
  }
  print_xformOps_abi_cxx11_
            (&local_1e8,(tinyusdz *)gprim,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(ulong)indent,
             indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string print_gprim_predefined(const T &gprim, const uint32_t indent) {
  std::stringstream ss;

  // properties
  ss << print_typed_attr(gprim.doubleSided, "doubleSided", indent);
  ss << print_typed_token_attr(gprim.orientation, "orientation", indent);
  ss << print_typed_token_attr(gprim.purpose, "purpose", indent);
  ss << print_typed_attr(gprim.extent, "extent", indent);

  ss << print_typed_token_attr(gprim.visibility, "visibility", indent);

  ss << print_material_binding(&gprim, indent);

  ss << print_collection(&gprim, indent);

  if (gprim.proxyPrim.authored()) {
    const Relationship &rel = gprim.proxyPrim.relationship();
    ss << print_relationship(rel, rel.get_listedit_qual(), /* custom */ false,
                             "proxyPrim", indent);
  }

  ss << print_xformOps(gprim.xformOps, indent);

  return ss.str();
}